

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunnerTest.cpp
# Opt level: O2

void __thiscall
TEST_CommandLineTestRunner_veryVerboseSetOnOutput_Test::testBody
          (TEST_CommandLineTestRunner_veryVerboseSetOnOutput_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  CommandLineTestRunnerWithStringBufferOutput commandLineTestRunner;
  char *argv [2];
  
  argv[0] = "tests.exe";
  argv[1] = "-vv";
  CommandLineTestRunnerWithStringBufferOutput::CommandLineTestRunnerWithStringBufferOutput
            (&commandLineTestRunner,2,argv,
             &(this->super_TEST_GROUP_CppUTestGroupCommandLineTestRunner).registry);
  CommandLineTestRunner::runAllTestsMain(&commandLineTestRunner.super_CommandLineTestRunner);
  pUVar1 = UtestShell::getCurrent();
  pcVar2 = SimpleString::asCharString
                     (&(commandLineTestRunner.fakeConsoleOutputWhichIsReallyABuffer)->output);
  (*pUVar1->_vptr_UtestShell[0xc])
            (pUVar1,"TEST(group1, test1)",pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineTestRunnerTest.cpp"
             ,0xdb);
  pUVar1 = UtestShell::getCurrent();
  pcVar2 = SimpleString::asCharString
                     (&(commandLineTestRunner.fakeConsoleOutputWhichIsReallyABuffer)->output);
  (*pUVar1->_vptr_UtestShell[0xc])
            (pUVar1,"destroyTest",pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineTestRunnerTest.cpp"
             ,0xdc);
  CommandLineTestRunner::~CommandLineTestRunner(&commandLineTestRunner.super_CommandLineTestRunner);
  return;
}

Assistant:

TEST(CommandLineTestRunner, veryVerboseSetOnOutput)
{
    const char* argv[] = { "tests.exe", "-vv"};

    CommandLineTestRunnerWithStringBufferOutput commandLineTestRunner(2, argv, &registry);
    commandLineTestRunner.runAllTestsMain();
    STRCMP_CONTAINS("TEST(group1, test1)", commandLineTestRunner.fakeConsoleOutputWhichIsReallyABuffer->getOutput().asCharString());
    STRCMP_CONTAINS("destroyTest", commandLineTestRunner.fakeConsoleOutputWhichIsReallyABuffer->getOutput().asCharString());
}